

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

diyfp nlohmann::json_abi_v3_11_3::detail::dtoa_impl::diyfp::normalize(diyfp x)

{
  ulong uVar1;
  uint64_t uVar2;
  diyfp dVar3;
  
  uVar1 = x._8_8_ & 0xffffffff;
  for (uVar2 = x.f; -1 < (long)uVar2; uVar2 = uVar2 * 2) {
    uVar1 = (ulong)((int)uVar1 - 1);
  }
  dVar3._8_8_ = uVar1;
  dVar3.f = uVar2;
  return dVar3;
}

Assistant:

static diyfp normalize(diyfp x) noexcept
    {
        JSON_ASSERT(x.f != 0);

        while ((x.f >> 63u) == 0)
        {
            x.f <<= 1u;
            x.e--;
        }

        return x;
    }